

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_layer.cpp
# Opt level: O2

ON_Layer *
ON_Layer::FromModelComponentRef
          (ON_ModelComponentReference *model_component_reference,ON_Layer *none_return_value)

{
  ON_ModelComponent *p;
  ON_Layer *pOVar1;
  
  p = ON_ModelComponentReference::ModelComponent(model_component_reference);
  pOVar1 = Cast(&p->super_ON_Object);
  if (pOVar1 == (ON_Layer *)0x0) {
    pOVar1 = none_return_value;
  }
  return pOVar1;
}

Assistant:

const ON_Layer* ON_Layer::FromModelComponentRef(
  const class ON_ModelComponentReference& model_component_reference,
  const ON_Layer* none_return_value
  )
{
  const ON_Layer* p = ON_Layer::Cast(model_component_reference.ModelComponent());
  return (nullptr != p) ? p : none_return_value;
}